

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * anon_unknown.dwarf_d38fa4::EvaluateDepfile
                   (string *__return_storage_ptr__,string *path,cmGeneratorExpression *ge,
                   cmLocalGenerator *lg,string *config)

{
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  config_00;
  pointer this;
  string *psVar1;
  string local_88;
  string local_58 [32];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmGeneratorExpression *ge_local;
  string *path_local;
  
  cge._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )config;
  std::__cxx11::string::string(local_58,(string *)path);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffffc8,(string *)ge);
  std::__cxx11::string::~string(local_58);
  this = std::
         unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
         ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)&stack0xffffffffffffffc8);
  config_00 = cge;
  std::__cxx11::string::string((string *)&local_88);
  psVar1 = cmCompiledGeneratorExpression::Evaluate
                     (this,lg,(string *)
                              config_00._M_t.
                              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                              _M_head_impl,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_88);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_88);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateDepfile(std::string const& path,
                            cmGeneratorExpression const& ge,
                            cmLocalGenerator* lg, std::string const& config)
{
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(path);
  return cge->Evaluate(lg, config);
}